

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberDeclaration_Enumerator.cpp
# Opt level: O0

ostream * psy::C::operator<<(ostream *os,EnumeratorDeclarationSymbol *enumerator)

{
  ostream *poVar1;
  Lexeme *this;
  Type *ty;
  string local_40;
  MemberDeclarationSymbol *local_20;
  EnumeratorDeclarationSymbol *enumerator_local;
  ostream *os_local;
  
  local_20 = &enumerator->super_MemberDeclarationSymbol;
  enumerator_local = (EnumeratorDeclarationSymbol *)os;
  if (enumerator == (EnumeratorDeclarationSymbol *)0x0) {
    os_local = std::operator<<(os,"<Enumerator is null>");
  }
  else {
    std::operator<<(os,"<Enumerator |");
    poVar1 = std::operator<<((ostream *)enumerator_local," name:");
    this = &MemberDeclarationSymbol::name(local_20)->super_Lexeme;
    Lexeme::valueText_abi_cxx11_(&local_40,this);
    std::operator<<(poVar1,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    poVar1 = std::operator<<((ostream *)enumerator_local," type:");
    ty = MemberDeclarationSymbol::type(local_20);
    operator<<(poVar1,ty);
    std::operator<<((ostream *)enumerator_local,">");
    os_local = (ostream *)enumerator_local;
  }
  return os_local;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const EnumeratorDeclarationSymbol* enumerator)
{
    if (!enumerator)
        return os << "<Enumerator is null>";
    os << "<Enumerator |";
    os << " name:" << enumerator->name()->valueText();
    os << " type:" << enumerator->type();
    os << ">";
    return os;
}